

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

Vector<int,_2> __thiscall tcu::computeScaledSize<2>(tcu *this,Vector<int,_2> *imageSize,int maxSize)

{
  bool bVar1;
  bool bVar2;
  deInt32 y;
  int iVar3;
  int *piVar4;
  undefined4 local_30;
  undefined4 local_2c;
  int i_2;
  int i_1;
  float d;
  int i;
  bool allInRange;
  int maxSize_local;
  Vector<int,_2> *imageSize_local;
  Vector<int,_2> *res;
  
  bVar1 = true;
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    bVar2 = false;
    if (bVar1) {
      piVar4 = Vector<int,_2>::operator[](imageSize,i_1);
      bVar2 = *piVar4 <= maxSize;
    }
    bVar1 = bVar2;
  }
  if (bVar1) {
    Vector<int,_2>::Vector((Vector<int,_2> *)this,imageSize);
  }
  else {
    i_2 = 0x3f800000;
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      piVar4 = Vector<int,_2>::operator[](imageSize,local_2c);
      i_2 = (int)de::max<float>((float)i_2,(float)*piVar4 / (float)maxSize);
    }
    Vector<int,_2>::Vector((Vector<int,_2> *)this);
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      piVar4 = Vector<int,_2>::operator[](imageSize,local_30);
      y = ::deRoundFloatToInt32((float)*piVar4 / (float)i_2);
      iVar3 = de::max<int>(1,y);
      piVar4 = Vector<int,_2>::operator[]((Vector<int,_2> *)this,local_30);
      *piVar4 = iVar3;
    }
  }
  return (Vector<int,_2>)(int  [2])this;
}

Assistant:

static Vector<int, Size> computeScaledSize (const Vector<int, Size>& imageSize, int maxSize)
{
	bool allInRange = true;
	for (int i = 0; i < Size; i++)
		allInRange = allInRange && (imageSize[i] <= maxSize);

	if (allInRange)
		return imageSize;
	else
	{
		float d = 1.0f;
		for (int i = 0; i < Size; i++)
			d = de::max(d, (float)imageSize[i] / (float)maxSize);

		Vector<int, Size> res;
		for (int i = 0; i < Size; i++)
			res[i] = de::max(1, deRoundFloatToInt32((float)imageSize[i] / d));

		return res;
	}
}